

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O1

int htmlIsBooleanAttr(xmlChar *name)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    iVar1 = xmlStrcasecmp(*(xmlChar **)((long)htmlBooleanAttrs + lVar2),name);
    if (iVar1 == 0) {
      return 1;
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x68);
  return 0;
}

Assistant:

int
htmlIsBooleanAttr(const xmlChar *name)
{
    int i = 0;

    while (htmlBooleanAttrs[i] != NULL) {
        if (xmlStrcasecmp((const xmlChar *)htmlBooleanAttrs[i], name) == 0)
            return 1;
        i++;
    }
    return 0;
}